

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  string *psVar1;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  undefined1 local_19;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *this_local;
  string *dir;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  cmAlphaNum::cmAlphaNum(&local_50,psVar1);
  cmAlphaNum::cmAlphaNum(&local_80,"/CMakeFiles/");
  psVar1 = GetName_abi_cxx11_(this);
  cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_50,&local_80,psVar1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".dir");
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSupportDirectory() const
{
  std::string dir = cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(),
                             "/CMakeFiles/", this->GetName());
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}